

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O0

ecs_entity_t ecs_lookup_child(ecs_world_t *world,ecs_entity_t parent,char *name)

{
  int32_t iVar1;
  ecs_vector_t *vector;
  void *pvVar2;
  ecs_entity_t eVar3;
  ecs_table_t *table;
  ecs_table_t **table_ptr;
  ecs_table_t **table_ptr_array;
  int table_ptr_count;
  int table_ptr_i;
  ecs_vector_t *child_tables;
  ecs_entity_t result;
  char *name_local;
  ecs_entity_t parent_local;
  ecs_world_t *world_local;
  
  vector = (ecs_vector_t *)_ecs_map_get_ptr(world->child_tables,parent);
  if (vector != (ecs_vector_t *)0x0) {
    iVar1 = ecs_vector_count(vector);
    pvVar2 = _ecs_vector_first(vector,8,0x10);
    for (table_ptr_array._4_4_ = 0; table_ptr_array._4_4_ < iVar1;
        table_ptr_array._4_4_ = table_ptr_array._4_4_ + 1) {
      eVar3 = find_child_in_table(*(ecs_table_t **)((long)pvVar2 + (long)table_ptr_array._4_4_ * 8),
                                  name);
      if (eVar3 != 0) {
        return eVar3;
      }
    }
  }
  return 0;
}

Assistant:

ecs_entity_t ecs_lookup_child(
    ecs_world_t *world,
    ecs_entity_t parent,
    const char *name)
{
    ecs_entity_t result = 0;

    ecs_vector_t *child_tables = ecs_map_get_ptr(
        world->child_tables, ecs_vector_t*, parent);
    
    if (child_tables) {
        ecs_vector_each(child_tables, ecs_table_t*, table_ptr, {
            ecs_table_t *table = *table_ptr;
            result = find_child_in_table(table, name);
            if (result) {
                return result;
            }
        });
    }

    return result;
}